

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

int64_t read_varint64(uint8_t **cursor,uint8_t *end)

{
  byte bVar1;
  uint32_t byte;
  uint32_t size;
  uint32_t shift;
  int64_t result;
  uint8_t *end_local;
  uint8_t **cursor_local;
  
  _size = 0;
  byte = 0;
  do {
    bVar1 = read_byte(cursor,end);
    _size = (bVar1 & 0x7f) << ((byte)byte & 0x1f) | _size;
    byte = byte + 7;
  } while ((bVar1 & 0x80) != 0);
  if ((byte < 0x40) && ((bVar1 & 0x40) != 0)) {
    _size = -1L << ((byte)byte & 0x3f) | _size;
  }
  return _size;
}

Assistant:

int64_t read_varint64 (uint8_t** cursor, const uint8_t* end)
{
    int64_t result = 0;
    uint32_t shift = 0;
    uint32_t size = 64;
    uint32_t byte = 0;
    do
    {
        byte = read_byte (cursor, end);
        result |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    // sign bit of byte is second high order bit (0x40)
    if ((shift < size) && (byte & 0x40))
        result |= (~((int64_t)0) << shift); // sign extend

    return result;
}